

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubdirCommand.cxx
# Opt level: O3

bool cmSubdirCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  string *psVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  undefined8 uVar9;
  bool excludeFromAll;
  pointer inName;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string binPath;
  string srcPath;
  string local_e8;
  undefined4 local_c4;
  string local_c0;
  pointer local_a0;
  undefined8 local_98;
  undefined8 local_90;
  char *local_88;
  undefined8 local_80;
  string local_78;
  string local_58;
  string *local_38;
  
  inName = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (inName == pbVar1) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    local_c4 = 0;
  }
  else {
    this = status->Makefile;
    local_38 = (string *)&status->Error;
    local_c4 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    excludeFromAll = false;
    do {
      iVar4 = std::__cxx11::string::compare((char *)inName);
      if (iVar4 == 0) {
        excludeFromAll = true;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)inName);
        if (iVar4 != 0) {
          psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          pcVar2 = (psVar5->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,pcVar2,pcVar2 + psVar5->_M_string_length);
          std::__cxx11::string::append((char *)&local_c0);
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_c0,(ulong)(inName->_M_dataplus)._M_p);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_78.field_2._M_allocated_capacity = *psVar8;
            local_78.field_2._8_8_ = plVar6[3];
          }
          else {
            local_78.field_2._M_allocated_capacity = *psVar8;
            local_78._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_78._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          bVar3 = cmsys::SystemTools::FileIsDirectory(&local_78);
          if (bVar3) {
            psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            pcVar2 = (psVar5->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e8,pcVar2,pcVar2 + psVar5->_M_string_length);
            std::__cxx11::string::append((char *)&local_e8);
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_e8,(ulong)(inName->_M_dataplus)._M_p);
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            psVar8 = puVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_c0.field_2._M_allocated_capacity = *psVar8;
              local_c0.field_2._8_8_ = puVar7[3];
            }
            else {
              local_c0.field_2._M_allocated_capacity = *psVar8;
              local_c0._M_dataplus._M_p = (pointer)*puVar7;
            }
            local_c0._M_string_length = puVar7[1];
            *puVar7 = psVar8;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            cmMakefile::AddSubDirectory(this,&local_78,&local_c0,excludeFromAll,false,false);
LAB_004b11fd:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            bVar3 = cmsys::SystemTools::FileIsDirectory(inName);
            if (bVar3) {
              psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              pcVar2 = (psVar5->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e8,pcVar2,pcVar2 + psVar5->_M_string_length);
              std::__cxx11::string::append((char *)&local_e8);
              cmsys::SystemTools::GetFilenameName(&local_58,inName);
              uVar9 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                uVar9 = local_e8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar9 < local_58._M_string_length + local_e8._M_string_length) {
                uVar9 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  uVar9 = local_58.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar9 < local_58._M_string_length + local_e8._M_string_length)
                goto LAB_004b104a;
                puVar7 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_58,0,(char *)0x0,(ulong)local_e8._M_dataplus._M_p)
                ;
              }
              else {
LAB_004b104a:
                puVar7 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_e8,(ulong)local_58._M_dataplus._M_p);
              }
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              psVar8 = puVar7 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar8) {
                local_c0.field_2._M_allocated_capacity = *psVar8;
                local_c0.field_2._8_8_ = puVar7[3];
              }
              else {
                local_c0.field_2._M_allocated_capacity = *psVar8;
                local_c0._M_dataplus._M_p = (pointer)*puVar7;
              }
              local_c0._M_string_length = puVar7[1];
              *puVar7 = psVar8;
              puVar7[1] = 0;
              *(undefined1 *)psVar8 = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              cmMakefile::AddSubDirectory(this,inName,&local_c0,excludeFromAll,false,false);
              goto LAB_004b11fd;
            }
            local_c0._M_dataplus._M_p = (pointer)0x26;
            local_c0._M_string_length = 0x942798;
            local_c0.field_2._M_allocated_capacity = 0;
            local_a0 = (inName->_M_dataplus)._M_p;
            local_c0.field_2._8_8_ = inName->_M_string_length;
            local_98 = 0;
            local_90 = 0x10;
            local_88 = " does not exist.";
            local_80 = 0;
            views._M_len = 3;
            views._M_array = (iterator)&local_c0;
            cmCatViews(&local_e8,views);
            std::__cxx11::string::_M_assign(local_38);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            local_c4 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
        }
      }
      inName = inName + 1;
    } while (inName != pbVar1);
  }
  return (bool)((byte)local_c4 & 1);
}

Assistant:

bool cmSubdirCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  bool res = true;
  bool excludeFromAll = false;
  cmMakefile& mf = status.GetMakefile();

  for (std::string const& i : args) {
    if (i == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (i == "PREORDER") {
      // Ignored
      continue;
    }

    // if they specified a relative path then compute the full
    std::string srcPath = mf.GetCurrentSourceDirectory() + "/" + i;
    if (cmSystemTools::FileIsDirectory(srcPath)) {
      std::string binPath = mf.GetCurrentBinaryDirectory() + "/" + i;
      mf.AddSubDirectory(srcPath, binPath, excludeFromAll, false, false);
    }
    // otherwise it is a full path
    else if (cmSystemTools::FileIsDirectory(i)) {
      // we must compute the binPath from the srcPath, we just take the last
      // element from the source path and use that
      std::string binPath = mf.GetCurrentBinaryDirectory() + "/" +
        cmSystemTools::GetFilenameName(i);
      mf.AddSubDirectory(i, binPath, excludeFromAll, false, false);
    } else {
      status.SetError(cmStrCat("Incorrect SUBDIRS command. Directory: ", i,
                               " does not exist."));
      res = false;
    }
  }
  return res;
}